

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O0

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::rehash_impl(robin_hash<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              *this,size_type count_)

{
  undefined1 uVar1;
  bool bVar2;
  truncated_hash_type tVar3;
  size_type bucket_count;
  value_type *key_value;
  ulong uVar4;
  robin_hash<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_RSI;
  size_t hash;
  bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false> *bucket;
  iterator __end0;
  iterator __begin0;
  buckets_container_type *__range3;
  bool use_stored_hash;
  robin_hash<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  new_table;
  robin_hash<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_ffffffffffffff18;
  robin_hash<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined7 in_stack_ffffffffffffff38;
  KeySelect local_a1;
  size_t local_a0;
  reference local_98;
  bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false> *local_90;
  __normal_iterator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>_*,_std::vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>_>_>_>
  in_stack_ffffffffffffff78;
  allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>
  *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff8c;
  hash<unsigned_long> *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffff98;
  power_of_two_growth_policy<2UL> in_stack_ffffffffffffffa0;
  
  get_allocator((robin_hash<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  robin_hash((robin_hash<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              *)in_stack_ffffffffffffffa0.m_mask,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90
             ,(equal_to<unsigned_long> *)
              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff80,(float)((ulong)in_stack_ffffffffffffff78._M_current >> 0x20),
             SUB84(in_stack_ffffffffffffff78._M_current,0));
  std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>::~allocator
            ((allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_> *)
             0x3f5ccb);
  bucket_count = robin_hash<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 ::bucket_count((robin_hash<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                                 *)&stack0xffffffffffffffa0);
  uVar1 = USE_STORED_HASH_ON_REHASH(bucket_count);
  uVar5 = (uint)(byte)uVar1 << 0x18;
  std::
  vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>_>_>
  ::begin((vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>_>_>
           *)in_stack_ffffffffffffff18);
  local_90 = (bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>
              *)std::
                vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>_>_>
                ::end((vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>_>_>
                       *)in_stack_ffffffffffffff18);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>_*,_std::vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>_>_>_>
                             *)in_stack_ffffffffffffff20,
                            (__normal_iterator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>_*,_std::vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>_>_>_>
                             *)in_stack_ffffffffffffff18), bVar2) {
    local_98 = __gnu_cxx::
               __normal_iterator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>_*,_std::vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>_>_>_>
               ::operator*((__normal_iterator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>_*,_std::vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>_>_>_>
                            *)&stack0xffffffffffffff78);
    bVar2 = bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>
            ::empty(local_98);
    if (!bVar2) {
      if ((uVar5 & 0x1000000) == 0) {
        key_value = bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>
                    ::value((bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>
                             *)0x3f5dbd);
        robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
        ::KeySelect::operator()(&local_a1,key_value);
        uVar4 = hash_key<unsigned_long>
                          (in_stack_ffffffffffffff20,(unsigned_long *)in_stack_ffffffffffffff18);
      }
      else {
        tVar3 = bucket_entry_hash<false>::truncated_hash((bucket_entry_hash<false> *)local_98);
        uVar4 = (ulong)tVar3;
      }
      in_stack_ffffffffffffff18 =
           (robin_hash<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
            *)&stack0xffffffffffffffa0;
      local_a0 = uVar4;
      in_stack_ffffffffffffff20 =
           (robin_hash<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
            *)bucket_for_hash(in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18);
      tVar3 = bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>
              ::truncate_hash(local_a0);
      bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>::value
                ((bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>
                  *)0x3f5e1c);
      insert_value_on_rehash
                (in_RSI,CONCAT17(uVar1,in_stack_ffffffffffffff38),(distance_type)(uVar4 >> 0x30),
                 (truncated_hash_type)uVar4,(value_type *)CONCAT44(tVar3,in_stack_ffffffffffffff28))
      ;
    }
    __gnu_cxx::
    __normal_iterator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>_*,_std::vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>_>_>_>
    ::operator++((__normal_iterator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>_*,_std::vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_false>_>_>_>
                  *)&stack0xffffffffffffff78);
  }
  swap(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  ~robin_hash((robin_hash<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<unsigned_long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<unsigned_long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *)0x3f5e73);
  return;
}

Assistant:

void rehash_impl(size_type count_) {
    robin_hash new_table(count_, static_cast<Hash&>(*this),
                         static_cast<KeyEqual&>(*this), get_allocator(),
                         m_min_load_factor, m_max_load_factor);
    tsl_rh_assert(size() <= new_table.m_load_threshold);

    const bool use_stored_hash =
        USE_STORED_HASH_ON_REHASH(new_table.bucket_count());
    for (auto& bucket : m_buckets_data) {
      if (bucket.empty()) {
        continue;
      }

      const std::size_t hash =
          use_stored_hash ? bucket.truncated_hash()
                          : new_table.hash_key(KeySelect()(bucket.value()));

      new_table.insert_value_on_rehash(new_table.bucket_for_hash(hash), 0,
                                       bucket_entry::truncate_hash(hash),
                                       std::move(bucket.value()));
    }

    new_table.m_nb_elements = m_nb_elements;
    new_table.swap(*this);
  }